

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

void ncnn::convolution_transform_kernel_packed_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,int kernel_w,
               int kernel_h,int elempack,int out_elempack)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int k;
  ulong uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int p;
  ulong uVar13;
  uint _w;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  Mat weight_data_r2;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar7 = 0;
  Mat::reshape(&local_78,weight_data,_w,num_input,num_output,(Allocator *)0x0);
  uVar6 = (ulong)(uint)out_elempack;
  Mat::create(weight_data_tm,_w,num_input / elempack,num_output / out_elempack,
              (uint)elempack * uVar6 * 4,out_elempack * elempack,(Allocator *)0x0);
  pvVar1 = weight_data_tm->data;
  sVar2 = weight_data_tm->cstep;
  sVar3 = weight_data_tm->elemsize;
  uVar15 = 0;
  if (0 < out_elempack) {
    uVar15 = (ulong)(uint)out_elempack;
  }
  uVar11 = 0;
  if (0 < elempack) {
    uVar11 = (ulong)(uint)elempack;
  }
  uVar14 = (ulong)_w;
  if ((int)_w < 1) {
    uVar14 = uVar7;
  }
  for (; (long)uVar7 < (long)num_output - (long)(out_elempack + -1);
      uVar7 = uVar7 + (long)out_elempack) {
    uVar13 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
    uVar6 = (long)uVar13 % (long)out_elempack & 0xffffffff;
    puVar4 = (undefined4 *)
             ((long)(int)((long)uVar13 / (long)out_elempack) * sVar2 * sVar3 + (long)pvVar1);
    for (uVar13 = 0; (long)uVar13 < (long)num_input - (long)(elempack + -1);
        uVar13 = uVar13 + (long)elempack) {
      lVar12 = 0;
      for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
        uVar6 = uVar13;
        for (uVar5 = 0; uVar5 != uVar11; uVar5 = uVar5 + 1) {
          puVar9 = (undefined4 *)
                   ((long)local_78.data +
                   ((long)local_78.w * uVar6 + uVar7 * local_78.cstep) * local_78.elemsize + lVar12)
          ;
          uVar10 = uVar15;
          while (bVar16 = uVar10 != 0, uVar10 = uVar10 - 1, bVar16) {
            *puVar4 = *puVar9;
            puVar4 = puVar4 + 1;
            puVar9 = (undefined4 *)((long)puVar9 + local_78.cstep * local_78.elemsize);
          }
          uVar6 = uVar6 + 1;
        }
        lVar12 = lVar12 + 4;
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])(local_78.allocator,local_78.data,uVar6);
      }
    }
  }
  return;
}

Assistant:

static void convolution_transform_kernel_packed_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, int kernel_w, int kernel_h, int elempack, int out_elempack)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }
}